

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
inja::Parser::Parser
          (Parser *this,ParserConfig *parser_config,LexerConfig *lexer_config,
          TemplateStorage *template_storage,FunctionStorage *function_storage)

{
  this->config = parser_config;
  (this->lexer).config = lexer_config;
  (this->lexer).state = Text;
  (this->lexer).minus_state = Number;
  (this->lexer).m_in._M_len = 0;
  (this->lexer).m_in._M_str = (char *)0x0;
  (this->lexer).tok_start = 0;
  (this->lexer).pos = 0;
  this->template_storage = template_storage;
  this->function_storage = function_storage;
  (this->tok).kind = Unknown;
  (this->tok).text._M_len = 0;
  (this->tok).text._M_str = (char *)0x0;
  (this->peek_tok).kind = Unknown;
  (this->peek_tok).text._M_len = 0;
  (this->peek_tok).text._M_str = (char *)0x0;
  this->have_peek_tok = false;
  (this->literal_start)._M_len = 0;
  (this->literal_start)._M_str = (char *)0x0;
  this->current_block = (BlockNode *)0x0;
  this->current_expression_list = (ExpressionListNode *)0x0;
  ::std::
  stack<inja::IfStatementNode*,std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>>
  ::stack<std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>,void>
            (&this->if_statement_stack);
  ::std::
  stack<inja::ForStatementNode*,std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>>
  ::stack<std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>,void>
            (&this->for_statement_stack);
  ::std::
  stack<inja::BlockStatementNode*,std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>>
  ::stack<std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>,void>
            (&this->block_statement_stack);
  return;
}

Assistant:

explicit Parser(const ParserConfig& parser_config, const LexerConfig& lexer_config, TemplateStorage& template_storage,
                  const FunctionStorage& function_storage)
      : config(parser_config), lexer(lexer_config), template_storage(template_storage), function_storage(function_storage) {}